

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::RelativePath
                   (string *__return_storage_ptr__,string *local,string *remote)

{
  bool bVar1;
  __type _Var2;
  uint uVar3;
  ulong uVar4;
  pointer pSVar5;
  vector<cmsys::String,_std::allocator<cmsys::String>_> localSplit;
  vector<cmsys::String,_std::allocator<cmsys::String>_> finalPath;
  vector<cmsys::String,_std::allocator<cmsys::String>_> remoteSplit;
  string l;
  vector<cmsys::String,_std::allocator<cmsys::String>_> commonPath;
  string r;
  string local_50 [32];
  
  bVar1 = FileIsFullPath(local);
  if ((!bVar1) || (bVar1 = FileIsFullPath(remote), !bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&l);
    return __return_storage_ptr__;
  }
  CollapseFullPath(&l,local);
  CollapseFullPath(&r,remote);
  SplitString(&localSplit,&l,'/',true);
  SplitString(&remoteSplit,&r,'/',true);
  commonPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commonPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commonPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar3 = 0;
      (uVar4 = (ulong)uVar3,
      uVar4 <= ((long)localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5) - 1U &&
      (uVar4 <= ((long)remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)); uVar3 = uVar3 + 1) {
    _Var2 = std::operator==(&localSplit.
                             super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar4].super_string,
                            &remoteSplit.
                             super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar4].super_string);
    if (!_Var2) break;
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
              (&commonPath,
               localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_start + uVar4);
    String::String((String *)local_50,"");
    std::__cxx11::string::operator=
              ((string *)
               (localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                .super__Vector_impl_data._M_start + uVar4),local_50);
    std::__cxx11::string::~string(local_50);
    String::String((String *)local_50,"");
    std::__cxx11::string::operator=
              ((string *)
               (remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                _M_impl.super__Vector_impl_data._M_start + uVar4),local_50);
    std::__cxx11::string::~string(local_50);
  }
  if (uVar4 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)remote);
  }
  else {
    for (uVar3 = 0;
        (ulong)uVar3 <
        (ulong)((long)localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
      if (localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3].super_string._M_string_length != 0) {
        String::String((String *)local_50,"../");
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                  (&finalPath,(String *)local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
    for (pSVar5 = remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar5 != remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pSVar5 = pSVar5 + 1) {
      if ((pSVar5->super_string)._M_string_length != 0) {
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back(&finalPath,pSVar5);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (pSVar5 = finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar5 != finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pSVar5 = pSVar5 + 1) {
      if ((__return_storage_ptr__->_M_string_length != 0) &&
         ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          != '/')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&finalPath);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&commonPath);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&remoteSplit);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&localSplit);
  std::__cxx11::string::~string((string *)&r);
  std::__cxx11::string::~string((string *)&l);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::RelativePath(const std::string& local,
                                      const std::string& remote)
{
  if (!SystemTools::FileIsFullPath(local)) {
    return "";
  }
  if (!SystemTools::FileIsFullPath(remote)) {
    return "";
  }

  std::string l = SystemTools::CollapseFullPath(local);
  std::string r = SystemTools::CollapseFullPath(remote);

  // split up both paths into arrays of strings using / as a separator
  std::vector<kwsys::String> localSplit =
    SystemTools::SplitString(l, '/', true);
  std::vector<kwsys::String> remoteSplit =
    SystemTools::SplitString(r, '/', true);
  std::vector<kwsys::String>
    commonPath; // store shared parts of path in this array
  std::vector<kwsys::String> finalPath; // store the final relative path here
  // count up how many matching directory names there are from the start
  unsigned int sameCount = 0;
  while (((sameCount <= (localSplit.size() - 1)) &&
          (sameCount <= (remoteSplit.size() - 1))) &&
// for windows and apple do a case insensitive string compare
#if defined(_WIN32) || defined(__APPLE__)
         SystemTools::Strucmp(localSplit[sameCount].c_str(),
                              remoteSplit[sameCount].c_str()) == 0
#else
         localSplit[sameCount] == remoteSplit[sameCount]
#endif
         ) {
    // put the common parts of the path into the commonPath array
    commonPath.push_back(localSplit[sameCount]);
    // erase the common parts of the path from the original path arrays
    localSplit[sameCount] = "";
    remoteSplit[sameCount] = "";
    sameCount++;
  }